

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O2

int default_import_callback
              (void *ctx,char *dir,char *file,char **found_here_cptr,char **buf,size_t *buflen)

{
  JsonnetVm *vm;
  pointer pbVar1;
  ImportStatus IVar2;
  char *pcVar3;
  int iVar4;
  allocator<char> local_f2;
  allocator<char> local_f1;
  JsonnetVm *local_f0;
  char **local_e8;
  size_t *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  jpaths;
  string local_b0;
  string err_msg;
  string found_here;
  string input;
  
  input._M_dataplus._M_p = (pointer)&input.field_2;
  input._M_string_length = 0;
  found_here._M_dataplus._M_p = (pointer)&found_here.field_2;
  found_here._M_string_length = 0;
  input.field_2._M_local_buf[0] = '\0';
  found_here.field_2._M_local_buf[0] = '\0';
  err_msg._M_dataplus._M_p = (pointer)&err_msg.field_2;
  err_msg._M_string_length = 0;
  err_msg.field_2._M_local_buf[0] = '\0';
  local_f0 = (JsonnetVm *)ctx;
  local_e0 = buflen;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,dir,&local_f2);
  std::__cxx11::string::string<std::allocator<char>>((string *)&jpaths,file,&local_f1);
  IVar2 = try_path(&local_b0,(string *)&jpaths,&input,&found_here,&err_msg);
  local_e8 = buf;
  std::__cxx11::string::~string((string *)&jpaths);
  std::__cxx11::string::~string((string *)&local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&jpaths,&local_f0->jpaths);
  do {
    pbVar1 = jpaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    vm = local_f0;
    if (IVar2 != IMPORT_STATUS_FILE_NOT_FOUND) {
      if (IVar2 == IMPORT_STATUS_OK) {
        pcVar3 = from_string(local_f0,&found_here);
        *found_here_cptr = pcVar3;
        pcVar3 = from_string_nonull(vm,&input,local_e0);
        *local_e8 = pcVar3;
        iVar4 = 0;
      }
      else {
        pcVar3 = from_string_nonull(local_f0,&err_msg,local_e0);
        *local_e8 = pcVar3;
LAB_001a4664:
        iVar4 = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&jpaths);
      std::__cxx11::string::~string((string *)&err_msg);
      std::__cxx11::string::~string((string *)&found_here);
      std::__cxx11::string::~string((string *)&input);
      return iVar4;
    }
    if (jpaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        jpaths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"no match locally or in the Jsonnet library paths.",&local_f2);
      pcVar3 = from_string_nonull(local_f0,&local_b0,local_e0);
      *local_e8 = pcVar3;
      std::__cxx11::string::~string((string *)&local_b0);
      goto LAB_001a4664;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,file,&local_f2);
    IVar2 = try_path(pbVar1 + -1,&local_b0,&input,&found_here,&err_msg);
    std::__cxx11::string::~string((string *)&local_b0);
    jpaths.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         jpaths.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    std::__cxx11::string::~string
              ((string *)
               jpaths.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  } while( true );
}

Assistant:

static int default_import_callback(void *ctx, const char *dir, const char *file,
                                   char **found_here_cptr, char **buf, size_t *buflen)
{
    auto *vm = static_cast<JsonnetVm *>(ctx);

    std::string input, found_here, err_msg;

    ImportStatus status = try_path(dir, file, input, found_here, err_msg);

    std::vector<std::string> jpaths(vm->jpaths);

    // If not found, try library search path.
    while (status == IMPORT_STATUS_FILE_NOT_FOUND) {
        if (jpaths.size() == 0) {
            const char *err = "no match locally or in the Jsonnet library paths.";
            *buf = from_string_nonull(vm, err, buflen);
            return 1;  // failure
        }
        status = try_path(jpaths.back(), file, input, found_here, err_msg);
        jpaths.pop_back();
    }

    if (status == IMPORT_STATUS_IO_ERROR) {
        *buf = from_string_nonull(vm, err_msg, buflen);
        return 1;  // failure
    }

    assert(status == IMPORT_STATUS_OK);
    *found_here_cptr = from_string(vm, found_here);
    *buf = from_string_nonull(vm, input, buflen);
    return 0;  // success
}